

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainUtils.c
# Opt level: O1

void Abc_UtilsSource(Abc_Frame_t *pAbc)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  char *pcVar4;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    sVar2 = strlen(pcVar1);
    pcVar3 = (char *)malloc(sVar2 + 2);
    sprintf(pcVar3,"%s/",pcVar1);
    pcVar1 = Extra_UtilFileSearch(".abc.rc",pcVar3,"r");
    if (pcVar3 != (char *)0x0) {
      free(pcVar3);
    }
  }
  pcVar3 = Extra_UtilFileSearch(".abc.rc",".","r");
  if (pcVar3 == (char *)0x0 || pcVar1 == (char *)0x0) {
    if (pcVar1 != (char *)0x0) {
      sVar2 = strlen(pcVar1);
      pcVar4 = (char *)malloc(sVar2 + 0xc);
      sprintf(pcVar4,"source -s %s",pcVar1);
      Cmd_CommandExecute(pAbc,pcVar4);
      if (pcVar4 != (char *)0x0) {
        free(pcVar4);
      }
    }
    if (pcVar3 == (char *)0x0) goto LAB_001cb1c7;
    sVar2 = strlen(pcVar3);
    __s = (char *)malloc(sVar2 + 0xc);
    pcVar4 = pcVar3;
  }
  else {
    sVar2 = strlen(pcVar1);
    __s = (char *)malloc(sVar2 + 0xc);
    pcVar4 = pcVar1;
  }
  sprintf(__s,"source -s %s",pcVar4);
  Cmd_CommandExecute(pAbc,__s);
  if (__s != (char *)0x0) {
    free(__s);
  }
LAB_001cb1c7:
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  Cmd_CommandExecute(pAbc,"source -s abc.rc");
  return;
}

Assistant:

void Abc_UtilsSource( Abc_Frame_t * pAbc )
{  
#ifdef WIN32
    if ( Cmd_CommandExecute(pAbc, "source abc.rc") )
    {
        if ( Cmd_CommandExecute(pAbc, "source ..\\abc.rc") == 0 )
            printf( "Loaded \"abc.rc\" from the parent directory.\n" );
        else if ( Cmd_CommandExecute(pAbc, "source ..\\..\\abc.rc") == 0 )
            printf( "Loaded \"abc.rc\" from the grandparent directory.\n" );
    }
#else

#if 0
    {
        char * sPath1, * sPath2;

         // If .rc is present in both the home and current directories, then read
         // it from the home directory.  Otherwise, read it from wherever it's located.
        sPath1 = Extra_UtilFileSearch(".rc", "~/", "r");
        sPath2 = Extra_UtilFileSearch(".rc", ".",  "r");
  
        if ( sPath1 && sPath2 ) {
            /* ~/.rc == .rc : Source the file only once */
            (void) Cmd_CommandExecute(pAbc, "source -s ~/.rc");
        }
        else {
            if (sPath1) {
                (void) Cmd_CommandExecute(pAbc, "source -s ~/.rc");
            }
            if (sPath2) {
                (void) Cmd_CommandExecute(pAbc, "source -s .rc");
            }
        }
        if ( sPath1 ) ABC_FREE(sPath1);
        if ( sPath2 ) ABC_FREE(sPath2);
    
        /* execute the abc script which can be open with the "open_path" */
        Cmd_CommandExecute( pAbc, "source -s abc.rc" );
    }
#endif

    {
        char * sPath1, * sPath2;
        char * home;

         // If .rc is present in both the home and current directories, then read
         // it from the home directory.  Otherwise, read it from wherever it's located.
        home = getenv("HOME");
        if (home){
            char * sPath3 = ABC_ALLOC(char, strlen(home) + 2);
            (void) sprintf(sPath3, "%s/", home);
            sPath1 = Extra_UtilFileSearch(".abc.rc", sPath3, "r");
            ABC_FREE(sPath3);
        }else
            sPath1 = NULL;

        sPath2 = Extra_UtilFileSearch(".abc.rc", ".",  "r");

        if ( sPath1 && sPath2 ) {
            /* ~/.rc == .rc : Source the file only once */
            char *tmp_cmd = ABC_ALLOC(char, strlen(sPath1)+12);
            (void) sprintf(tmp_cmd, "source -s %s", sPath1);
            // (void) Cmd_CommandExecute(pAbc, "source -s ~/.abc.rc");
            (void) Cmd_CommandExecute(pAbc, tmp_cmd);
            ABC_FREE(tmp_cmd);
        }
        else {
            if (sPath1) {
                char *tmp_cmd = ABC_ALLOC(char, strlen(sPath1)+12);
                (void) sprintf(tmp_cmd, "source -s %s", sPath1);
                // (void) Cmd_CommandExecute(pAbc, "source -s ~/.abc.rc");
                (void) Cmd_CommandExecute(pAbc, tmp_cmd);
                ABC_FREE(tmp_cmd);
            }
            if (sPath2) {
                char *tmp_cmd = ABC_ALLOC(char, strlen(sPath2)+12);
                (void) sprintf(tmp_cmd, "source -s %s", sPath2);
                // (void) Cmd_CommandExecute(pAbc, "source -s .abc.rc");
                (void) Cmd_CommandExecute(pAbc, tmp_cmd);
                ABC_FREE(tmp_cmd);
            }
        }
        if ( sPath1 ) ABC_FREE(sPath1);
        if ( sPath2 ) ABC_FREE(sPath2);

        /* execute the abc script which can be open with the "open_path" */
        Cmd_CommandExecute( pAbc, "source -s abc.rc" );
    }
    
#endif //WIN32
}